

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

ushort __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::GetInteriorAddressIndex
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *interiorAddress)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  undefined8 *in_FS_OFFSET;
  char *pcVar6;
  
  pcVar6 = (this->super_HeapBlock).address;
  if (interiorAddress < pcVar6 || pcVar6 + 0x8000 <= interiorAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x246,
                       "(interiorAddress >= address && interiorAddress < this->GetEndAddress())",
                       "interiorAddress >= address && interiorAddress < this->GetEndAddress()");
    if (!bVar3) goto LAB_0023007e;
    *puVar1 = 0;
    pcVar6 = (this->super_HeapBlock).address;
  }
  iVar5 = (int)pcVar6;
  if (((ulong)pcVar6 & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x247,"(HeapInfo::IsAlignedAddress(address))",
                       "HeapInfo::IsAlignedAddress(address)");
    if (!bVar3) goto LAB_0023007e;
    *puVar1 = 0;
    iVar5 = (int)(this->super_HeapBlock).address;
  }
  uVar4 = ValidPointers<MediumAllocationBlockAttributes>::GetInteriorAddressIndex
                    (&this->validPointers,(uint)((int)interiorAddress - iVar5) >> 4);
  if (0x800 < (ushort)(uVar4 + 1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x24e,
                       "(index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || index <= TBlockAttributes::MaxAddressBit)"
                       ,
                       "index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || index <= TBlockAttributes::MaxAddressBit"
                      );
    if (!bVar3) {
LAB_0023007e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return uVar4;
}

Assistant:

ushort
SmallHeapBlockT<TBlockAttributes>::GetInteriorAddressIndex(void * interiorAddress)
{
    Assert(interiorAddress >= address && interiorAddress < this->GetEndAddress());
    Assert(HeapInfo::IsAlignedAddress(address));

    unsigned int offset = (unsigned int)((char*)interiorAddress - address);
    offset = offset >> HeapConstants::ObjectAllocationShift;

    ushort index = validPointers.GetInteriorAddressIndex(offset);
    Assert(index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit ||
        index <= TBlockAttributes::MaxAddressBit);
    return index;
}